

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O1

double wdm::impl::ktau_stat_adjust
                 (vector<double,_std::allocator<double>_> *x,
                 vector<double,_std::allocator<double>_> *y,
                 vector<double,_std::allocator<double>_> *weights)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  allocator_type local_119;
  double local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  double local_f8;
  undefined8 uStack_f0;
  vector<double,_std::allocator<double>_> *local_e8;
  undefined8 uStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_90;
  vector<double,_std::allocator<double>_> local_88;
  double local_68;
  value_type_conflict local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  utils::check_sizes(x,y,weights);
  utils::sort_all(x,y,weights);
  pdVar1 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4;
  uVar7 = (long)uVar5 >> 3;
  if (uVar7 < 2) {
    uVar10 = 1;
    dVar12 = 0.0;
    local_b8 = 0.0;
    dVar19 = 0.0;
  }
  else {
    dVar12 = 0.0;
    uVar9 = 1;
    uVar10 = 1;
    dVar19 = 0.0;
    local_b8 = 0.0;
    do {
      if ((pdVar4[uVar9] != pdVar4[uVar9 - 1]) || (NAN(pdVar4[uVar9]) || NAN(pdVar4[uVar9 - 1]))) {
        if (1 < uVar10) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar10 - 1) * uVar10;
            auVar24._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar24._0_8_ = lVar6;
            auVar24._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar27 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar6) -
                     4503599627370496.0);
          }
          else {
            dVar27 = dVar19 * dVar19 - dVar12;
          }
          local_b8 = local_b8 + dVar27 * 0.5;
          uVar10 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar10 == 1) {
            dVar19 = pdVar1[uVar9 - 1];
            dVar12 = dVar19 * dVar19;
          }
          dVar27 = pdVar1[uVar9];
          dVar19 = dVar19 + dVar27;
          dVar12 = dVar12 + dVar27 * dVar27;
        }
        uVar10 = uVar10 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (1 < uVar10) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar10 - 1) * uVar10;
      auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar13._0_8_ = lVar6;
      auVar13._12_4_ = 0x45300000;
      dVar12 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar12 = dVar19 * dVar19 - dVar12;
    }
    local_b8 = local_b8 + dVar12 * 0.5;
  }
  uStack_b0 = 0;
  local_e8 = weights;
  if (uVar5 < 0x11) {
    uVar5 = 2;
    local_108 = ZEXT816(0x8000000000000000);
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    local_118 = 0.0;
    uStack_110 = 0;
    local_f8 = 0.0;
    uStack_f0 = 0;
  }
  else {
    local_f8 = 0.0;
    uStack_f0 = 0;
    uVar7 = 2;
    uVar5 = 2;
    local_108 = ZEXT816(0);
    local_118 = 0.0;
    uStack_110 = 0;
    local_d8 = 0.0;
    dStack_d0 = 0.0;
    do {
      dVar19 = pdVar4[uVar7];
      if (((dVar19 != pdVar4[uVar7 - 1]) || (dVar19 != pdVar4[uVar7 - 2])) ||
         (NAN(dVar19) || NAN(pdVar4[uVar7 - 2]))) {
        if (2 < uVar5) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar5 - 2) * (uVar5 - 1) * uVar5;
            auVar21._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar21._0_8_ = lVar6;
            auVar21._12_4_ = 0x45300000;
            dVar19 = (double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0;
            dVar12 = auVar21._8_8_ - 1.9342813113834067e+25;
          }
          else {
            dVar19 = pow(local_118,3.0);
            dVar19 = (double)local_108._0_8_ * -3.0 * local_118 + dVar19;
            dVar12 = local_f8 + local_f8;
          }
          local_d8 = local_d8 + (dVar12 + dVar19) / 6.0;
          uVar5 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar5 == 1) {
            local_118 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar7 - 1];
            local_108._8_8_ = 0;
            local_108._0_8_ = local_118 * local_118;
            uStack_110 = 0;
            local_f8 = pow(local_118,3.0);
            uStack_f0 = extraout_XMM0_Qb;
          }
          dVar19 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          local_118 = local_118 + dVar19;
          local_108._0_8_ = (double)local_108._0_8_ + dVar19 * dVar19;
          dVar19 = pow(dVar19,3.0);
          local_f8 = local_f8 + dVar19;
        }
        uVar5 = uVar5 + 1;
      }
      uVar7 = uVar7 + 1;
      pdVar4 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
    local_108._0_8_ = (double)local_108._0_8_ * -3.0;
  }
  if (2 < uVar5) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar5 - 2) * (uVar5 - 1) * uVar5;
      auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = 0x45300000;
      dVar19 = (auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar19 = pow(local_118,3.0);
      dVar19 = local_f8 + local_f8 + (double)local_108._0_8_ * local_118 + dVar19;
    }
    local_d8 = local_d8 + dVar19 / 6.0;
  }
  pvVar20 = local_e8;
  pdVar1 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
  if (uVar5 < 2) {
    uVar7 = 1;
    local_90 = 0.0;
    dVar19 = 0.0;
    dVar12 = 0.0;
  }
  else {
    dVar12 = 0.0;
    uVar10 = 1;
    uVar7 = 1;
    dVar19 = 0.0;
    local_90 = 0.0;
    do {
      if ((pdVar4[uVar10] != pdVar4[uVar10 - 1]) || (NAN(pdVar4[uVar10]) || NAN(pdVar4[uVar10 - 1]))
         ) {
        if (1 < uVar7) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar7 * 2 + 5) * (uVar7 - 1) * uVar7;
            auVar25._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar25._0_8_ = lVar6;
            auVar25._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar27 = (auVar25._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar6) -
                     4503599627370496.0);
          }
          else {
            dVar27 = (dVar19 + dVar19 + 5.0) * (dVar19 * dVar19 - dVar12);
          }
          local_90 = local_90 + dVar27;
          uVar7 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar7 == 1) {
            dVar19 = pdVar1[uVar10 - 1];
            dVar12 = dVar19 * dVar19;
          }
          dVar27 = pdVar1[uVar10];
          dVar19 = dVar19 + dVar27;
          dVar12 = dVar12 + dVar27 * dVar27;
        }
        uVar7 = uVar7 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  if (1 < uVar7) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar7 * 2 + 5) * (uVar7 - 1) * uVar7;
      auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar15._0_8_ = lVar6;
      auVar15._12_4_ = 0x45300000;
      local_90 = local_90 +
                 (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      local_90 = local_90 + (dVar19 + dVar19 + 5.0) * (dVar19 * dVar19 - dVar12);
    }
  }
  utils::sort_all(y,x,local_e8);
  pdVar1 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4;
  uVar7 = (long)uVar5 >> 3;
  if (uVar7 < 2) {
    uVar10 = 1;
    dVar12 = 0.0;
    local_c8 = 0.0;
    dVar19 = 0.0;
  }
  else {
    dVar12 = 0.0;
    uVar9 = 1;
    uVar10 = 1;
    dVar19 = 0.0;
    local_c8 = 0.0;
    do {
      if ((pdVar4[uVar9] != pdVar4[uVar9 - 1]) || (NAN(pdVar4[uVar9]) || NAN(pdVar4[uVar9 - 1]))) {
        if (1 < uVar10) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar10 - 1) * uVar10;
            auVar28._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar28._0_8_ = lVar6;
            auVar28._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar27 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar6) -
                     4503599627370496.0);
          }
          else {
            dVar27 = dVar19 * dVar19 - dVar12;
          }
          local_c8 = local_c8 + dVar27 * 0.5;
          uVar10 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar10 == 1) {
            dVar19 = pdVar1[uVar9 - 1];
            dVar12 = dVar19 * dVar19;
          }
          dVar27 = pdVar1[uVar9];
          dVar19 = dVar19 + dVar27;
          dVar12 = dVar12 + dVar27 * dVar27;
        }
        uVar10 = uVar10 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  if (1 < uVar10) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar10 - 1) * uVar10;
      auVar16._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar16._0_8_ = lVar6;
      auVar16._12_4_ = 0x45300000;
      dVar12 = (auVar16._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar12 = dVar19 * dVar19 - dVar12;
    }
    local_c8 = local_c8 + dVar12 * 0.5;
  }
  uStack_c0 = 0;
  if (uVar5 < 0x11) {
    uVar5 = 2;
    local_108 = ZEXT816(0x8000000000000000);
    local_a8 = 0.0;
    uStack_a0 = 0;
    local_118 = 0.0;
    uStack_110 = 0;
    local_f8 = 0.0;
    uStack_f0 = 0;
  }
  else {
    local_f8 = 0.0;
    uStack_f0 = 0;
    uVar7 = 2;
    uVar5 = 2;
    local_108 = ZEXT816(0);
    local_118 = 0.0;
    uStack_110 = 0;
    local_a8 = 0.0;
    uStack_a0 = 0;
    do {
      dVar19 = pdVar4[uVar7];
      if (((dVar19 != pdVar4[uVar7 - 1]) || (dVar19 != pdVar4[uVar7 - 2])) ||
         (NAN(dVar19) || NAN(pdVar4[uVar7 - 2]))) {
        if (2 < uVar5) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar5 - 2) * (uVar5 - 1) * uVar5;
            auVar22._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar22._0_8_ = lVar6;
            auVar22._12_4_ = 0x45300000;
            dVar19 = (double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0;
            dVar12 = auVar22._8_8_ - 1.9342813113834067e+25;
          }
          else {
            dVar19 = pow(local_118,3.0);
            dVar19 = (double)local_108._0_8_ * -3.0 * local_118 + dVar19;
            dVar12 = local_f8 + local_f8;
          }
          local_a8 = local_a8 + (dVar12 + dVar19) / 6.0;
          uVar5 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar5 == 1) {
            local_118 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar7 - 1];
            local_108._8_8_ = 0;
            local_108._0_8_ = local_118 * local_118;
            uStack_110 = 0;
            local_f8 = pow(local_118,3.0);
            uStack_f0 = extraout_XMM0_Qb_00;
          }
          dVar19 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar7];
          local_118 = local_118 + dVar19;
          local_108._0_8_ = (double)local_108._0_8_ + dVar19 * dVar19;
          dVar19 = pow(dVar19,3.0);
          local_f8 = local_f8 + dVar19;
        }
        uVar5 = uVar5 + 1;
      }
      uVar7 = uVar7 + 1;
      pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3));
    local_108._0_8_ = (double)local_108._0_8_ * -3.0;
  }
  if (2 < uVar5) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar5 - 2) * (uVar5 - 1) * uVar5;
      auVar17._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar17._0_8_ = lVar6;
      auVar17._12_4_ = 0x45300000;
      dVar19 = (auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      dVar19 = pow(local_118,3.0);
      dVar19 = local_f8 + local_f8 + (double)local_108._0_8_ * local_118 + dVar19;
    }
    local_a8 = local_a8 + dVar19 / 6.0;
  }
  pdVar1 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar5 = (long)(y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
  if (uVar5 < 2) {
    uVar7 = 1;
    local_68 = 0.0;
    dVar19 = 0.0;
    dVar12 = 0.0;
  }
  else {
    dVar12 = 0.0;
    uVar10 = 1;
    uVar7 = 1;
    dVar19 = 0.0;
    local_68 = 0.0;
    do {
      if ((pdVar4[uVar10] != pdVar4[uVar10 - 1]) || (NAN(pdVar4[uVar10]) || NAN(pdVar4[uVar10 - 1]))
         ) {
        if (1 < uVar7) {
          if (pdVar2 == pdVar1) {
            lVar6 = (uVar7 * 2 + 5) * (uVar7 - 1) * uVar7;
            auVar26._8_4_ = (int)((ulong)lVar6 >> 0x20);
            auVar26._0_8_ = lVar6;
            auVar26._12_4_ = 0x45300000;
            dVar27 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
          }
          else {
            dVar27 = (dVar19 + dVar19 + 5.0) * (dVar19 * dVar19 - dVar12);
          }
          local_68 = local_68 + dVar27;
          uVar7 = 1;
        }
      }
      else {
        if (pdVar2 != pdVar1) {
          if (uVar7 == 1) {
            dVar19 = pdVar1[uVar10 - 1];
            dVar12 = dVar19 * dVar19;
          }
          dVar27 = pdVar1[uVar10];
          dVar19 = dVar19 + dVar27;
          dVar12 = dVar12 + dVar27 * dVar27;
        }
        uVar7 = uVar7 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  if (1 < uVar7) {
    if (pdVar2 == pdVar1) {
      lVar6 = (uVar7 * 2 + 5) * (uVar7 - 1) * uVar7;
      auVar18._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar18._0_8_ = lVar6;
      auVar18._12_4_ = 0x45300000;
      local_68 = local_68 +
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    }
    else {
      local_68 = local_68 + (dVar19 + dVar19 + 5.0) * (dVar19 * dVar19 - dVar12);
    }
  }
  if (pdVar2 == pdVar1) {
    local_60 = 1.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_88,
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_60,&local_119);
    pdVar1 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1);
    }
    if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  pvVar20 = local_e8;
  pdVar1 = (local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(local_e8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar6 == 0) {
    local_108._0_8_ = 0.0;
  }
  else {
    lVar6 = lVar6 >> 3;
    local_108._0_8_ = 0.0;
    lVar8 = 0;
    do {
      local_108._0_8_ = (double)local_108._0_8_ + pdVar1[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  }
  local_118 = utils::perm_sum(local_e8,2);
  local_48 = utils::perm_sum(pvVar20,3);
  local_60 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_88,
             (long)(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,&local_60,&local_119);
  pdVar1 = (pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    lVar8 = 0;
    do {
      lVar11 = 2;
      do {
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar8] =
             pdVar1[lVar8] *
             local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar6 + (ulong)(lVar6 == 0));
  }
  if ((long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    pvVar20 = (vector<double,_std::allocator<double>_> *)0x0;
  }
  else {
    lVar6 = (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    pvVar20 = (vector<double,_std::allocator<double>_> *)0x0;
    lVar8 = 0;
    do {
      pvVar20 = (vector<double,_std::allocator<double>_> *)
                ((double)pvVar20 +
                local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar8);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    local_e8 = pvVar20;
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pvVar20 = local_e8;
  }
  local_f8 = (double)local_108._0_8_ / (double)pvVar20;
  local_108._0_8_ = ((double)local_108._0_8_ + (double)local_108._0_8_) * (local_118 + local_118);
  dVar19 = pow(local_f8,3.0);
  local_108._0_8_ = dVar19 * (double)local_108._0_8_;
  local_58 = local_b8 * 2.0;
  dStack_50 = local_d8 * 6.0;
  local_d8 = local_118 * 4.0;
  dStack_d0 = local_48 * 54.0;
  local_e8 = (vector<double,_std::allocator<double>_> *)(local_f8 * local_f8);
  uStack_e0 = 0;
  dVar19 = pow(local_f8,3.0);
  auVar23._0_8_ = local_c8 * local_58 * 2.0;
  auVar23._8_8_ = local_a8 * dStack_50 * 6.0;
  auVar3._8_8_ = dStack_d0;
  auVar3._0_8_ = local_d8;
  auVar24 = divpd(auVar23,auVar3);
  local_d8 = (double)local_e8 * auVar24._0_8_;
  dStack_d0 = dVar19 * auVar24._8_8_;
  dVar19 = pow(local_f8,3.0);
  local_118 = ((local_118 - local_c8) * (local_118 - local_b8)) /
              (dStack_d0 + local_d8 +
              ((double)local_108._0_8_ - (local_90 - local_68) * dVar19) / 18.0);
  if (local_118 < 0.0) {
    local_118 = sqrt(local_118);
  }
  else {
    local_118 = SQRT(local_118);
  }
  return (double)local_e8 * local_118;
}

Assistant:

inline double ktau_stat_adjust(
    std::vector<double> x,
    std::vector<double> y,
    std::vector<double> weights)
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs and triplets of tied x and simultaneous ties in x and y.
    double pair_x = utils::count_tied_pairs(x, weights);
    double trip_x = utils::count_tied_triplets(x, weights);
    double v_x = utils::count_ties_v(x, weights);

    // 2.1 Sort y and weights in y order; break ties according to x.
    utils::sort_all(y, x, weights);

    // 2.2 Count pairs and triplets of tied y.
    double pair_y = utils::count_tied_pairs(y, weights);
    double trip_y = utils::count_tied_triplets(y, weights);
    double v_y = utils::count_ties_v(y, weights);

    // 3. Calculate adjustment factor.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double s = utils::sum(weights);
    double s2 = utils::perm_sum(weights, 2);
    double s3 = utils::perm_sum(weights, 3);
    double r = s / utils::sum(utils::pow(weights, 2));
    double v_0 = 2 * s2 * (2 * s) * std::pow(r, 3);
    double v_1 = 2 * pair_x * 2 * pair_y / (2 * 2 * s2) * std::pow(r, 2);
    double v_2 = 6 * trip_x * 6 * trip_y / (9 * 6 * s3) * std::pow(r, 3);
    double v = (v_0 - std::pow(r, 3) * (v_x - v_y)) / 18 + (v_1 + v_2);
    return std::pow(r, 2) * std::sqrt((s2 - pair_x) * (s2 - pair_y) / v);
}